

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelwriter.h
# Opt level: O3

int __thiscall ModelWriter::shape_inference(ModelWriter *this)

{
  Option *pOVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  pointer ppLVar5;
  pointer pBVar6;
  pointer pBVar7;
  Layer *pLVar8;
  Allocator *pAVar9;
  pointer pMVar10;
  void *pvVar11;
  long *plVar12;
  undefined8 uVar13;
  char cVar14;
  int iVar15;
  int *piVar16;
  pointer piVar17;
  bool bVar18;
  long lVar19;
  pointer piVar20;
  Mat *pMVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  Extractor ex;
  Mat local_a8;
  pointer local_58;
  Extractor local_50;
  pointer local_40;
  pointer local_38;
  
  if (this->has_custom_layer == true) {
    shape_inference();
LAB_0015b3c4:
    iVar15 = -1;
  }
  else {
    ppLVar5 = (this->layers->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    local_58 = (this->layers->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    lVar19 = (long)local_58 - (long)ppLVar5 >> 3;
    pBVar6 = (this->blobs->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pBVar7 = (this->blobs->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_58 != ppLVar5) {
      pOVar1 = &(this->super_Net).opt;
      lVar25 = 0;
      do {
        pLVar8 = (this->layers->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[lVar25];
        (*pLVar8->_vptr_Layer[5])(pLVar8,pOVar1);
        iVar15 = (*pLVar8->_vptr_Layer[4])(pLVar8,pOVar1);
        if (iVar15 != 0) {
          shape_inference();
          goto LAB_0015b3c4;
        }
        lVar25 = lVar25 + 1;
      } while (lVar19 + (ulong)(lVar19 == 0) != lVar25);
    }
    local_40 = pBVar6;
    local_38 = pBVar7;
    ncnn::Net::create_extractor((Net *)&local_50);
    ncnn::Extractor::set_light_mode(&local_50,true);
    if (local_58 != ppLVar5) {
      lVar25 = 0;
      do {
        pLVar8 = (this->layers->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[lVar25];
        iVar15 = std::__cxx11::string::compare((char *)&pLVar8->type);
        if ((iVar15 != 0) &&
           (iVar15 = std::__cxx11::string::compare((char *)&pLVar8->type), iVar15 == 0)) {
          iVar15 = *(int *)&pLVar8[1]._vptr_Layer;
          iVar3 = *(int *)((long)&pLVar8[1]._vptr_Layer + 4);
          iVar4._0_1_ = pLVar8[1].support_bf16_storage;
          iVar4._1_1_ = pLVar8[1].support_fp16_storage;
          iVar4._2_1_ = pLVar8[1].support_int8_storage;
          iVar4._3_1_ = pLVar8[1].support_image_storage;
          bVar26 = iVar15 != 0;
          bVar18 = (iVar3 == 0 && iVar4 == 0) && bVar26;
          bVar27 = iVar3 == 0;
          bVar28 = iVar4 == 0;
          cVar14 = bVar18;
          if (bVar28) {
            cVar14 = '\x02';
          }
          if (bVar27 || !bVar26) {
            cVar14 = bVar18;
          }
          if (!bVar28 && (!bVar27 && bVar26)) {
            cVar14 = '\x03';
          }
          if (cVar14 == '\0') {
            shape_inference((ModelWriter *)pLVar8);
            iVar15 = -1;
            goto LAB_0015b21d;
          }
          local_a8.cstep = 0;
          local_a8.data = (void *)0x0;
          local_a8.refcount._0_4_ = 0;
          local_a8.refcount._4_4_ = 0;
          local_a8.elemsize._0_4_ = 0;
          local_a8.elemsize._4_4_ = 0;
          local_a8.elempack = 0;
          local_a8.h = 0;
          local_a8.d = 0;
          local_a8.c = 0;
          local_a8.allocator = (Allocator *)0x0;
          local_a8.dims = 0;
          local_a8.w = 0;
          if (cVar14 == '\x03') {
LAB_0015b328:
            ncnn::Mat::create(&local_a8,iVar15,iVar3,iVar4,4,(Allocator *)0x0);
          }
          else if (cVar14 == '\x02') {
            ncnn::Mat::create(&local_a8,iVar15,iVar3,4,(Allocator *)0x0);
            if (!bVar28 && (!bVar27 && bVar26)) goto LAB_0015b328;
          }
          else {
            ncnn::Mat::create(&local_a8,iVar15,4,(Allocator *)0x0);
          }
          ncnn::Extractor::input
                    (&local_50,
                     **(int **)&(pLVar8->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl
                     ,&local_a8);
          piVar16 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
          if (piVar16 != (int *)0x0) {
            LOCK();
            *piVar16 = *piVar16 + -1;
            UNLOCK();
            if (*piVar16 == 0) {
              if (local_a8.allocator == (Allocator *)0x0) {
                if (local_a8.data != (void *)0x0) {
                  free(local_a8.data);
                }
              }
              else {
                (*(local_a8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        lVar25 = lVar25 + 1;
      } while (lVar19 + (ulong)(lVar19 == 0) != lVar25);
    }
    if (local_38 != local_40) {
      lVar22 = ((long)local_38 - (long)local_40 >> 4) * 0x6db6db6db6db6db7;
      lVar25 = 0x60;
      lVar23 = 0;
      do {
        pBVar6 = (this->blobs->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        iVar15 = *(int *)((long)pBVar6 + lVar25 + -0x10);
        if (iVar15 != 0) {
          iVar3 = *(int *)((long)pBVar6 + lVar25 + -0xc);
          iVar4 = *(int *)((long)pBVar6 + lVar25 + -8);
          local_a8.cstep = 0;
          local_a8.data = (void *)0x0;
          local_a8.refcount._0_4_ = 0;
          local_a8.refcount._4_4_ = 0;
          local_a8.elemsize._0_4_ = 0;
          local_a8.elemsize._4_4_ = 0;
          local_a8.elempack = 0;
          local_a8.h = 0;
          local_a8.d = 0;
          local_a8.c = 0;
          local_a8.allocator = (Allocator *)0x0;
          local_a8.dims = 0;
          local_a8.w = 0;
          if (iVar15 == 3) {
            ncnn::Mat::create(&local_a8,iVar3,iVar4,
                              *(int *)((long)&(pBVar6->name)._M_dataplus._M_p + lVar25),4,
                              (Allocator *)0x0);
          }
          else if (iVar15 == 2) {
            ncnn::Mat::create(&local_a8,iVar3,iVar4,4,(Allocator *)0x0);
          }
          else if (iVar15 == 1) {
            ncnn::Mat::create(&local_a8,iVar3,4,(Allocator *)0x0);
          }
          if (0 < local_a8.c * (int)local_a8.cstep) {
            memset(local_a8.data,0,(ulong)(uint)(local_a8.c * (int)local_a8.cstep) << 2);
          }
          ncnn::Extractor::input(&local_50,(int)lVar23,&local_a8);
          piVar16 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
          if (piVar16 != (int *)0x0) {
            LOCK();
            *piVar16 = *piVar16 + -1;
            UNLOCK();
            if (*piVar16 == 0) {
              if (local_a8.allocator == (Allocator *)0x0) {
                if (local_a8.data != (void *)0x0) {
                  free(local_a8.data);
                }
              }
              else {
                (*(local_a8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        lVar23 = lVar23 + 1;
        lVar25 = lVar25 + 0x70;
      } while (lVar22 + (ulong)(lVar22 == 0) != lVar23);
    }
    fwrite("shape_inference\n",0x10,1,_stderr);
    if (local_58 != ppLVar5) {
      lVar25 = 0;
      do {
        pLVar8 = (this->layers->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[lVar25];
        iVar15 = std::__cxx11::string::compare((char *)&pLVar8->type);
        if ((iVar15 != 0) &&
           (piVar17 = (pLVar8->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
           (pLVar8->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish != piVar17)) {
          uVar24 = 0;
          do {
            iVar15 = piVar17[uVar24];
            local_a8.cstep = 0;
            local_a8.data = (void *)0x0;
            local_a8.refcount._0_4_ = 0;
            local_a8.refcount._4_4_ = 0;
            local_a8.elemsize._0_4_ = 0;
            local_a8.elemsize._4_4_ = 0;
            local_a8.elempack = 0;
            local_a8.h = 0;
            local_a8.d = 0;
            local_a8.c = 0;
            local_a8.allocator = (Allocator *)0x0;
            local_a8.dims = 0;
            local_a8.w = 0;
            ncnn::Extractor::extract(&local_50,iVar15,&local_a8,0);
            pBVar6 = (this->blobs->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            pMVar21 = &pBVar6[iVar15].shape;
            piVar16 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
            if (pMVar21 != &local_a8) {
              if (piVar16 != (int *)0x0) {
                LOCK();
                *piVar16 = *piVar16 + 1;
                UNLOCK();
              }
              piVar16 = pBVar6[iVar15].shape.refcount;
              if (piVar16 != (int *)0x0) {
                LOCK();
                *piVar16 = *piVar16 + -1;
                UNLOCK();
                if (*piVar16 == 0) {
                  pAVar9 = pBVar6[iVar15].shape.allocator;
                  if (pAVar9 == (Allocator *)0x0) {
                    if (pMVar21->data != (void *)0x0) {
                      free(pMVar21->data);
                    }
                  }
                  else {
                    (*pAVar9->_vptr_Allocator[3])();
                  }
                }
              }
              pBVar6[iVar15].shape.cstep = 0;
              pMVar21->data = (void *)0x0;
              pBVar6[iVar15].shape.refcount = (int *)0x0;
              *(undefined8 *)((long)&pBVar6[iVar15].shape.refcount + 4) = 0;
              *(undefined8 *)((long)&pBVar6[iVar15].shape.elemsize + 4) = 0;
              pBVar6[iVar15].shape.dims = 0;
              pBVar6[iVar15].shape.w = 0;
              pBVar6[iVar15].shape.h = 0;
              pBVar6[iVar15].shape.d = 0;
              pBVar6[iVar15].shape.c = 0;
              pMVar21->data = local_a8.data;
              piVar16 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
              pBVar6[iVar15].shape.refcount = piVar16;
              pBVar6[iVar15].shape.elemsize =
                   CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize);
              pBVar6[iVar15].shape.elempack = local_a8.elempack;
              pBVar6[iVar15].shape.allocator = local_a8.allocator;
              pBVar6[iVar15].shape.dims = local_a8.dims;
              pBVar6[iVar15].shape.w = local_a8.w;
              pBVar6[iVar15].shape.h = local_a8.h;
              pBVar6[iVar15].shape.d = local_a8.d;
              pBVar6[iVar15].shape.c = local_a8.c;
              pBVar6[iVar15].shape.cstep = local_a8.cstep;
            }
            if (piVar16 != (int *)0x0) {
              LOCK();
              *piVar16 = *piVar16 + -1;
              UNLOCK();
              if (*piVar16 == 0) {
                if (local_a8.allocator == (Allocator *)0x0) {
                  if (local_a8.data != (void *)0x0) {
                    free(local_a8.data);
                  }
                }
                else {
                  (*(local_a8.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            uVar24 = uVar24 + 1;
            piVar17 = (pLVar8->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
          } while (uVar24 < (ulong)((long)(pLVar8->tops).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_finish - (long)piVar17 >> 2));
        }
        lVar25 = lVar25 + 1;
      } while (lVar25 != lVar19 + (ulong)(lVar19 == 0));
      if (local_58 != ppLVar5) {
        lVar25 = 0;
        do {
          pLVar8 = (this->layers->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                   ._M_impl.super__Vector_impl_data._M_start[lVar25];
          iVar15 = std::__cxx11::string::compare((char *)&pLVar8->type);
          if (iVar15 != 0) {
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                      (&pLVar8->bottom_shapes,
                       (long)(pLVar8->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                       *(long *)&(pLVar8->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data >> 2);
            piVar17 = (pLVar8->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar20 = (pLVar8->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            if (piVar20 != piVar17) {
              lVar22 = 0;
              uVar24 = 0;
              do {
                iVar15 = piVar17[uVar24];
                pBVar6 = (this->blobs->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                         _M_impl.super__Vector_impl_data._M_start;
                pMVar10 = (pLVar8->bottom_shapes).
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data._M_start;
                puVar2 = (undefined8 *)((long)&pMVar10->data + lVar22);
                if ((Mat *)puVar2 != &pBVar6[iVar15].shape) {
                  piVar16 = pBVar6[iVar15].shape.refcount;
                  if (piVar16 != (int *)0x0) {
                    LOCK();
                    *piVar16 = *piVar16 + 1;
                    UNLOCK();
                  }
                  piVar16 = *(int **)((long)&pMVar10->refcount + lVar22);
                  if (piVar16 != (int *)0x0) {
                    LOCK();
                    *piVar16 = *piVar16 + -1;
                    UNLOCK();
                    if (*piVar16 == 0) {
                      pvVar11 = *(void **)((long)&pMVar10->data + lVar22);
                      plVar12 = *(long **)((long)&pMVar10->allocator + lVar22);
                      if (plVar12 == (long *)0x0) {
                        if (pvVar11 != (void *)0x0) {
                          free(pvVar11);
                        }
                      }
                      else {
                        (**(code **)(*plVar12 + 0x18))();
                      }
                    }
                  }
                  *(undefined8 *)((long)&pMVar10->cstep + lVar22) = 0;
                  *(undefined8 *)((long)puVar2 + 0xc) = 0;
                  *(undefined8 *)((long)puVar2 + 0x14) = 0;
                  *puVar2 = 0;
                  puVar2[1] = 0;
                  puVar2 = (undefined8 *)((long)&pMVar10->dims + lVar22);
                  *puVar2 = 0;
                  puVar2[1] = 0;
                  *(undefined4 *)((long)&pMVar10->c + lVar22) = 0;
                  piVar16 = pBVar6[iVar15].shape.refcount;
                  puVar2 = (undefined8 *)((long)&pMVar10->data + lVar22);
                  *puVar2 = pBVar6[iVar15].shape.data;
                  puVar2[1] = piVar16;
                  *(size_t *)((long)&pMVar10->elemsize + lVar22) = pBVar6[iVar15].shape.elemsize;
                  *(int *)((long)&pMVar10->elempack + lVar22) = pBVar6[iVar15].shape.elempack;
                  *(Allocator **)((long)&pMVar10->allocator + lVar22) =
                       pBVar6[iVar15].shape.allocator;
                  uVar13 = *(undefined8 *)&pBVar6[iVar15].shape.h;
                  puVar2 = (undefined8 *)((long)&pMVar10->dims + lVar22);
                  *puVar2 = *(undefined8 *)&pBVar6[iVar15].shape.dims;
                  puVar2[1] = uVar13;
                  *(int *)((long)&pMVar10->c + lVar22) = pBVar6[iVar15].shape.c;
                  *(size_t *)((long)&pMVar10->cstep + lVar22) = pBVar6[iVar15].shape.cstep;
                  piVar17 = (pLVar8->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  piVar20 = (pLVar8->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                }
                uVar24 = uVar24 + 1;
                lVar22 = lVar22 + 0x48;
              } while (uVar24 < (ulong)((long)piVar20 - (long)piVar17 >> 2));
            }
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                      (&pLVar8->top_shapes,
                       (long)(pLVar8->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       *(long *)&(pLVar8->tops).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data >> 2);
            piVar17 = (pLVar8->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar20 = (pLVar8->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            if (piVar20 != piVar17) {
              lVar22 = 0;
              uVar24 = 0;
              do {
                iVar15 = piVar17[uVar24];
                pBVar6 = (this->blobs->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                         _M_impl.super__Vector_impl_data._M_start;
                pMVar10 = (pLVar8->top_shapes).
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data._M_start;
                puVar2 = (undefined8 *)((long)&pMVar10->data + lVar22);
                if ((Mat *)puVar2 != &pBVar6[iVar15].shape) {
                  piVar16 = pBVar6[iVar15].shape.refcount;
                  if (piVar16 != (int *)0x0) {
                    LOCK();
                    *piVar16 = *piVar16 + 1;
                    UNLOCK();
                  }
                  piVar16 = *(int **)((long)&pMVar10->refcount + lVar22);
                  if (piVar16 != (int *)0x0) {
                    LOCK();
                    *piVar16 = *piVar16 + -1;
                    UNLOCK();
                    if (*piVar16 == 0) {
                      pvVar11 = *(void **)((long)&pMVar10->data + lVar22);
                      plVar12 = *(long **)((long)&pMVar10->allocator + lVar22);
                      if (plVar12 == (long *)0x0) {
                        if (pvVar11 != (void *)0x0) {
                          free(pvVar11);
                        }
                      }
                      else {
                        (**(code **)(*plVar12 + 0x18))();
                      }
                    }
                  }
                  *(undefined8 *)((long)&pMVar10->cstep + lVar22) = 0;
                  *(undefined8 *)((long)puVar2 + 0xc) = 0;
                  *(undefined8 *)((long)puVar2 + 0x14) = 0;
                  *puVar2 = 0;
                  puVar2[1] = 0;
                  puVar2 = (undefined8 *)((long)&pMVar10->dims + lVar22);
                  *puVar2 = 0;
                  puVar2[1] = 0;
                  *(undefined4 *)((long)&pMVar10->c + lVar22) = 0;
                  piVar16 = pBVar6[iVar15].shape.refcount;
                  puVar2 = (undefined8 *)((long)&pMVar10->data + lVar22);
                  *puVar2 = pBVar6[iVar15].shape.data;
                  puVar2[1] = piVar16;
                  *(size_t *)((long)&pMVar10->elemsize + lVar22) = pBVar6[iVar15].shape.elemsize;
                  *(int *)((long)&pMVar10->elempack + lVar22) = pBVar6[iVar15].shape.elempack;
                  *(Allocator **)((long)&pMVar10->allocator + lVar22) =
                       pBVar6[iVar15].shape.allocator;
                  uVar13 = *(undefined8 *)&pBVar6[iVar15].shape.h;
                  puVar2 = (undefined8 *)((long)&pMVar10->dims + lVar22);
                  *puVar2 = *(undefined8 *)&pBVar6[iVar15].shape.dims;
                  puVar2[1] = uVar13;
                  *(int *)((long)&pMVar10->c + lVar22) = pBVar6[iVar15].shape.c;
                  *(size_t *)((long)&pMVar10->cstep + lVar22) = pBVar6[iVar15].shape.cstep;
                  piVar17 = (pLVar8->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  piVar20 = (pLVar8->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                }
                uVar24 = uVar24 + 1;
                lVar22 = lVar22 + 0x48;
              } while (uVar24 < (ulong)((long)piVar20 - (long)piVar17 >> 2));
            }
          }
          lVar25 = lVar25 + 1;
        } while (lVar25 != lVar19 + (ulong)(lVar19 == 0));
      }
    }
    iVar15 = 0;
LAB_0015b21d:
    ncnn::Extractor::~Extractor(&local_50);
  }
  return iVar15;
}

Assistant:

int ModelWriter::shape_inference()
{
    if (has_custom_layer)
    {
        fprintf(stderr, "model has custom layer, shape_inference skipped\n");
        return -1;
    }

    const size_t layer_count = layers.size();
    const size_t blob_count = blobs.size();

    // recreate layer pipeline for param and weight changes
    for (size_t i = 0; i < layer_count; i++)
    {
        ncnn::Layer* layer = layers[i];

        layer->destroy_pipeline(opt);

        int cret = layer->create_pipeline(opt);
        if (cret != 0)
        {
            NCNN_LOGE("layer create_pipeline %d %s failed", (int)i, layer->name.c_str());
            return -1;
        }
    }

    ncnn::Extractor ex = create_extractor();
    ex.set_light_mode(true);

    // prepare Input blobs
    for (size_t i = 0; i < layer_count; i++)
    {
        const ncnn::Layer* layer = layers[i];
        if (layer->type == "ncnnfused")
            continue;

        if (layer->type != "Input")
            continue;

        ncnn::Input* input = (ncnn::Input*)layer;

        int w = input->w;
        int h = input->h;
        int c = input->c;

        int dims = 0;
        if (w == 0 && h == 0 && c == 0) dims = 0;
        if (w != 0 && h == 0 && c == 0) dims = 1;
        if (w != 0 && h != 0 && c == 0) dims = 2;
        if (w != 0 && h != 0 && c != 0) dims = 3;

        if (dims == 0)
        {
            fprintf(stderr, "Input layer %s without shape info, shape_inference skipped\n", layer->name.c_str());
            return -1;
        }

        ncnn::Mat m;
        if (dims == 1) m.create(w);
        if (dims == 2) m.create(w, h);
        if (dims == 3) m.create(w, h, c);

        ex.input(layer->tops[0], m);
    }

    // prepare blobs with predefined shape
    for (size_t i = 0; i < blob_count; i++)
    {
        const ncnn::Blob& blob = blobs[i];

        int dims = blob.shape.dims;
        int w = blob.shape.w;
        int h = blob.shape.h;
        int c = blob.shape.c;

        if (dims == 0)
            continue;

        ncnn::Mat m;
        if (dims == 1) m.create(w);
        if (dims == 2) m.create(w, h);
        if (dims == 3) m.create(w, h, c);

        m.fill(0.f);

        ex.input(int(i), m);
    }

    fprintf(stderr, "shape_inference\n");

    // resolve all layer output blob shape
    for (size_t i = 0; i < layer_count; i++)
    {
        const ncnn::Layer* layer = layers[i];
        if (layer->type == "ncnnfused")
            continue;

        for (size_t j = 0; j < layer->tops.size(); j++)
        {
            int top_blob_index = layer->tops[j];

            ncnn::Mat m;
            ex.extract(top_blob_index, m);

            blobs[top_blob_index].shape = m;
        }
    }

    // assign all layer blob shape
    for (size_t i = 0; i < layer_count; i++)
    {
        ncnn::Layer* layer = layers[i];
        if (layer->type == "ncnnfused")
            continue;

        layer->bottom_shapes.resize(layer->bottoms.size());
        for (size_t j = 0; j < layer->bottoms.size(); j++)
        {
            int bottom_blob_index = layer->bottoms[j];

            layer->bottom_shapes[j] = blobs[bottom_blob_index].shape;
        }

        layer->top_shapes.resize(layer->tops.size());
        for (size_t j = 0; j < layer->tops.size(); j++)
        {
            int top_blob_index = layer->tops[j];

            layer->top_shapes[j] = blobs[top_blob_index].shape;

            //             fprintf(stderr, "%d %4d %4d %4d | %2d %s\n", blobs[top_blob_index].shape.dims, blobs[top_blob_index].shape.w, blobs[top_blob_index].shape.h, blobs[top_blob_index].shape.c, top_blob_index, blobs[top_blob_index].name.c_str());
        }
    }

    return 0;
}